

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<wchar_t>::Matcher(Matcher<wchar_t> *this,wchar_t value)

{
  wchar_t local_2c;
  MatcherBase<wchar_t> local_28;
  
  (this->super_MatcherBase<wchar_t>).impl_.value_ = (MatcherInterface<wchar_t> *)0x0;
  (this->super_MatcherBase<wchar_t>).impl_.link_.next_ =
       &(this->super_MatcherBase<wchar_t>).impl_.link_;
  (this->super_MatcherBase<wchar_t>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001ba118;
  local_2c = value;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<wchar_t> *)&local_28,(EqMatcher *)&local_2c);
  internal::linked_ptr<const_testing::MatcherInterface<wchar_t>_>::operator=
            (&(this->super_MatcherBase<wchar_t>).impl_,&local_28.impl_);
  internal::MatcherBase<wchar_t>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }